

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O1

idx_t __thiscall
duckdb::StandardColumnData::Fetch
          (StandardColumnData *this,ColumnScanState *state,row_t row_id,Vector *result)

{
  idx_t iVar1;
  reference state_00;
  ColumnScanState child_state;
  ColumnScanState local_c8;
  
  if ((state->child_states).
      super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
      super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (state->child_states).
      super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
      super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.current = (ColumnSegment *)0x0;
    local_c8.segment_tree = (ColumnSegmentTree *)0x0;
    local_c8.row_index = 0;
    local_c8.internal_index = 0;
    local_c8.scan_state.
    super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>._M_t.
    super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
    .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (__uniq_ptr_data<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true,_true>
          )0x0;
    local_c8.child_states.
    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
    super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.child_states.
    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
    super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.child_states.
    super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
    super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.initialized = false;
    local_c8.segment_checked = false;
    local_c8.previous_states.
    super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.previous_states.
    super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.previous_states.
    super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.last_offset._0_4_ = 0;
    local_c8.last_offset._4_4_ = 0;
    local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
         (_Bit_pointer)0x0;
    local_c8.scan_options.ptr = (state->scan_options).ptr;
    ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::
    emplace_back<duckdb::ColumnScanState>
              (&(state->child_states).
                super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>,
               &local_c8);
    if ((void *)CONCAT44(local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_c8.scan_child_column.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._4_4_,
                                       local_c8.scan_child_column.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._0_4_));
      local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ = 0;
      local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._4_4_ = 0;
      local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
           = (_Bit_pointer)0x0;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    ::~vector(&local_c8.previous_states.
               super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
             );
    ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::~vector
              (&local_c8.child_states.
                super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>);
    if ((_Head_base<0UL,_duckdb::SegmentScanState_*,_false>)
        local_c8.scan_state.
        super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
        .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl !=
        (_Head_base<0UL,_duckdb::SegmentScanState_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_c8.scan_state.
          super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
          .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl)[1])();
    }
  }
  iVar1 = ColumnData::Fetch(&this->super_ColumnData,state,row_id,result);
  state_00 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,0);
  ColumnData::Fetch(&(this->validity).super_ColumnData,state_00,row_id,result);
  return iVar1;
}

Assistant:

idx_t StandardColumnData::Fetch(ColumnScanState &state, row_t row_id, Vector &result) {
	// fetch validity mask
	if (state.child_states.empty()) {
		ColumnScanState child_state;
		child_state.scan_options = state.scan_options;
		state.child_states.push_back(std::move(child_state));
	}
	auto scan_count = ColumnData::Fetch(state, row_id, result);
	validity.Fetch(state.child_states[0], row_id, result);
	return scan_count;
}